

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_view_args.cpp
# Opt level: O0

void node::ReadCoinsViewArgs(ArgsManager *args,CoinsViewOptions *options)

{
  bool bVar1;
  long *plVar2;
  long *in_RSI;
  long in_FS_OFFSET;
  optional<long> oVar3;
  optional<long> value_1;
  optional<long> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  string *strArg;
  ArgsManager *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  allocator<char> local_6a;
  string local_69 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  strArg = local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,(allocator<char> *)strArg);
  oVar3 = ArgsManager::GetIntArg(in_stack_ffffffffffffff70,strArg);
  local_69[0].field_2._1_8_ =
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  local_69[0].field_2._9_1_ =
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_engaged;
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  bVar1 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffff28);
  if (bVar1) {
    plVar2 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff28);
    *in_RSI = *plVar2;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,(allocator<char> *)strArg);
  oVar3 = ArgsManager::GetIntArg(in_stack_ffffffffffffff70,strArg);
  local_69[0]._1_8_ =
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  local_69[0]._M_string_length._1_1_ =
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_engaged;
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  std::allocator<char>::~allocator(&local_6a);
  bVar1 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffff28);
  if (bVar1) {
    plVar2 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff28);
    *(int *)(in_RSI + 1) = (int)*plVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ReadCoinsViewArgs(const ArgsManager& args, CoinsViewOptions& options)
{
    if (auto value = args.GetIntArg("-dbbatchsize")) options.batch_write_bytes = *value;
    if (auto value = args.GetIntArg("-dbcrashratio")) options.simulate_crash_ratio = *value;
}